

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O1

void opj_destroy_cstr_info_v2(opj_codestream_info_v2_t **cstr_info)

{
  opj_tccp_info_t *__ptr;
  
  if (cstr_info != (opj_codestream_info_v2_t **)0x0) {
    __ptr = ((*cstr_info)->m_default_tile_info).tccp_info;
    if (__ptr != (opj_tccp_info_t *)0x0) {
      free(__ptr);
    }
    free(*cstr_info);
    *cstr_info = (opj_codestream_info_v2_t *)0x0;
  }
  return;
}

Assistant:

void OPJ_CALLCONV opj_destroy_cstr_info_v2(opj_codestream_info_v2_t **cstr_info) {
	if (cstr_info) {

		if ((*cstr_info)->m_default_tile_info.tccp_info){
			opj_free((*cstr_info)->m_default_tile_info.tccp_info);
		}

		if ((*cstr_info)->tile_info){
			/* FIXME not used for the moment*/
		}

		opj_free((*cstr_info));
		(*cstr_info) = NULL;
	}
}